

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

double mpack_expect_double_range(mpack_reader_t *reader,double min_value,double max_value)

{
  mpack_error_t mVar1;
  mpack_reader_t *pmVar2;
  double val;
  double max_value_local;
  double min_value_local;
  mpack_reader_t *reader_local;
  
  pmVar2 = (mpack_reader_t *)mpack_expect_double(reader);
  mVar1 = mpack_reader_error(reader);
  reader_local = (mpack_reader_t *)min_value;
  if ((mVar1 == mpack_ok) &&
     (((double)pmVar2 < min_value || (reader_local = pmVar2, max_value < (double)pmVar2)))) {
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local = (mpack_reader_t *)min_value;
  }
  return (double)reader_local;
}

Assistant:

double mpack_expect_double_range(mpack_reader_t* reader, double min_value, double max_value) {MPACK_EXPECT_RANGE_IMPL(double, double)}